

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

string * __thiscall
tchecker::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tchecker *this,sync_id_t sync_id,system_t *system)

{
  bool bVar1;
  process_id_t id;
  event_id_t id_00;
  sync_strength_t sVar2;
  synchronization_t *constraints;
  __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
  *p_Var3;
  reference this_00;
  processes_t *this_01;
  string *psVar4;
  ostream *poVar5;
  events_t *this_02;
  undefined4 in_register_00000014;
  range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
  rVar6;
  sync_constraint_t *constr;
  __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
  it;
  range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
  r;
  stringstream local_200 [8];
  stringstream ss;
  ostream local_1f0 [376];
  undefined1 local_78 [8];
  synchronization_t sync;
  system_t *system_local;
  sync_id_t sync_id_local;
  
  sync._attributes._map._M_h._M_single_bucket =
       (__node_base_ptr)CONCAT44(in_register_00000014,sync_id);
  constraints = tchecker::system::synchronizations_t::synchronization
                          ((synchronizations_t *)
                           (sync._attributes._map._M_h._M_single_bucket + 0x5b),(sync_id_t)this);
  tchecker::system::synchronization_t::synchronization_t((synchronization_t *)local_78,constraints);
  std::__cxx11::stringstream::stringstream(local_200);
  std::operator<<(local_1f0,"<");
  rVar6 = tchecker::system::synchronization_t::synchronization_constraints
                    ((synchronization_t *)local_78);
  it = rVar6._begin._M_current;
  p_Var3 = range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
           ::begin((range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
                    *)&it);
  constr = p_Var3->_M_current;
  while( true ) {
    p_Var3 = range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
             ::end((range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
                    *)&it);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
                        *)&constr,p_Var3);
    if (!bVar1) break;
    p_Var3 = range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
             ::begin((range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>_>
                      *)&it);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
                        *)&constr,p_Var3);
    if (bVar1) {
      std::operator<<(local_1f0,",");
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
              ::operator*((__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
                           *)&constr);
    this_01 = (processes_t *)(sync._attributes._map._M_h._M_single_bucket + 0x52);
    id = tchecker::system::sync_constraint_t::pid(this_00);
    psVar4 = tchecker::system::processes_t::process_name_abi_cxx11_(this_01,id);
    poVar5 = std::operator<<(local_1f0,(string *)psVar4);
    poVar5 = std::operator<<(poVar5,"@");
    this_02 = (events_t *)(sync._attributes._map._M_h._M_single_bucket + 0x26);
    id_00 = tchecker::system::sync_constraint_t::event_id(this_00);
    psVar4 = tchecker::system::events_t::event_name_abi_cxx11_(this_02,id_00);
    std::operator<<(poVar5,(string *)psVar4);
    sVar2 = tchecker::system::sync_constraint_t::strength(this_00);
    if (sVar2 == SYNC_WEAK) {
      std::operator<<(local_1f0,"?");
    }
    __gnu_cxx::
    __normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
    ::operator++((__normal_iterator<const_tchecker::system::sync_constraint_t_*,_std::vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>_>
                  *)&constr);
  }
  std::operator<<(local_1f0,">");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_200);
  tchecker::system::synchronization_t::~synchronization_t((synchronization_t *)local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tchecker::sync_id_t sync_id, tchecker::system::system_t const & system)
{
  tchecker::system::synchronization_t sync = system.synchronization(sync_id);

  std::stringstream ss;
  ss << "<";
  auto r = sync.synchronization_constraints();
  for (auto it = r.begin(); it != r.end(); ++it) {
    if (it != r.begin())
      ss << ",";
    tchecker::system::sync_constraint_t const & constr = *it;
    ss << system.process_name(constr.pid()) << "@" << system.event_name(constr.event_id());
    if (constr.strength() == tchecker::SYNC_WEAK)
      ss << "?";
  }
  ss << ">";
  return ss.str();
}